

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
should_visit_empty_repeating_group::Visitor::operator()
          (Visitor *this,
          VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *param_1,VersionnedMessageRef<Fixpp::v44::Version,_Fixpp::Chars<_B_,__E_>,_Fixpp::Required<Fixpp::TagT<923U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<553U,_Fixpp::Type::String>_>,_Fixpp::TagT<926U,_Fixpp::Type::Int>,_Fixpp::TagT<927U,_Fixpp::Type::String>_>
                   *param_2)

{
  char *in_R9;
  internal local_58 [8];
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper local_20;
  
  local_58[0] = (internal)0x0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  testing::Message::Message((Message *)&local_28);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar_.message_,local_58,(AssertionResult *)"false","false","true",in_R9)
  ;
  testing::internal::AssertHelper::AssertHelper
            (&local_20,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
             ,0x169,(char *)gtest_ar_.message_.ptr_);
  testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_20);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar_);
  return;
}

Assistant:

void operator()(HeaderT, MessageT)
        {
            ASSERT_TRUE(false);
        }